

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O2

int Bac_CommandRead(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Io_FileType_t FileType;
  FILE *__stream;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar5;
  Bac_Man_t *pBVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar3 = false;
  bVar2 = false;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"apvh"), iVar4 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x70) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (iVar4 != 0x61) {
        Abc_Print(-2,"usage: @_read [-apvh] <file_name>\n");
        Abc_Print(-2,"\t         reads hierarchical design in BLIF or Verilog\n");
        pcVar9 = "yes";
        pcVar8 = "yes";
        if (!bVar1) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle using old ABC parser [default = %s]\n",pcVar8);
        pcVar8 = "yes";
        if (!bVar3) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle using Ptr construction [default = %s]\n",pcVar8);
        if (!bVar2) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (globalUtilOptind + 1 != argc) {
    pcVar8 = "Bac_CommandRead(): Input file name should be given on the command line.";
LAB_00319548:
    puts(pcVar8);
    return 0;
  }
  pcVar8 = argv[globalUtilOptind];
  __stream = fopen(pcVar8,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(1,"Cannot open input file \"%s\". ",pcVar8);
    pcVar8 = Extra_FileGetSimilarName(pcVar8,".v",".blif",".smt",".bac",(char *)0x0);
    if (pcVar8 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar8);
    }
    Abc_Print(1,"\n");
    return 0;
  }
  fclose(__stream);
  if (bVar1 || bVar3) {
    FileType = Io_ReadFileType(pcVar8);
    pNtk = Io_ReadNetlist(pcVar8,FileType,0);
    pVVar5 = Ptr_AbcDeriveDes(pNtk);
    pBVar6 = Bac_PtrTransformToCba(pVVar5);
    Bac_PtrFree(pVVar5);
    if (pBVar6 != (Bac_Man_t *)0x0) {
      if (pBVar6->pSpec != (char *)0x0) {
        free(pBVar6->pSpec);
        pBVar6->pSpec = (char *)0x0;
      }
      pcVar8 = pNtk->pSpec;
      if (pcVar8 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar8);
        pcVar9 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar9,pcVar8);
      }
      pBVar6->pSpec = pcVar9;
    }
    Abc_NtkDelete(pNtk);
    goto LAB_00319689;
  }
  pcVar9 = Extra_FileNameExtension(pcVar8);
  iVar4 = strcmp(pcVar9,"blif");
  if (iVar4 == 0) {
    pVVar5 = Psr_ManReadBlif(pcVar8);
LAB_0031965b:
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      if (pVVar5->nSize == 0) {
        pBVar6 = (Bac_Man_t *)0x0;
      }
      else {
        pBVar6 = Psr_ManBuildCba(pcVar8,pVVar5);
      }
      Psr_ManVecFree(pVVar5);
      goto LAB_00319689;
    }
  }
  else {
    pcVar9 = Extra_FileNameExtension(pcVar8);
    if ((*pcVar9 == 'v') && (pcVar9[1] == '\0')) {
      pVVar5 = Psr_ManReadVerilog(pcVar8);
      goto LAB_0031965b;
    }
    pcVar9 = Extra_FileNameExtension(pcVar8);
    iVar4 = strcmp(pcVar9,"smt");
    if (iVar4 != 0) {
      pcVar9 = Extra_FileNameExtension(pcVar8);
      iVar4 = strcmp(pcVar9,"bac");
      if (iVar4 != 0) {
        pcVar8 = "Unrecognized input file extension.";
        goto LAB_00319548;
      }
      pBVar6 = Bac_ManReadBac(pcVar8);
      goto LAB_00319689;
    }
  }
  pBVar6 = (Bac_Man_t *)0x0;
LAB_00319689:
  Bac_AbcFreeMan(pAbc);
  pAbc->pAbcBac = pBVar6;
  return 0;
}

Assistant:

int Bac_CommandRead( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Bac_Man_t * p = NULL;
    Vec_Ptr_t * vDes = NULL;
    char * pFileName = NULL;
    int c, fUseAbc = 0, fUsePtr = 0, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "apvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAbc ^= 1;
            break;
        case 'p':
            fUsePtr ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Bac_CommandRead(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".blif", ".smt", ".bac", NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );
    // perform reading
    if ( fUseAbc || fUsePtr )
    {
        extern Vec_Ptr_t * Ptr_AbcDeriveDes( Abc_Ntk_t * pNtk );
        Abc_Ntk_t * pAbcNtk = Io_ReadNetlist( pFileName, Io_ReadFileType(pFileName), 0 );
        Vec_Ptr_t * vDes = Ptr_AbcDeriveDes( pAbcNtk );
        p = Bac_PtrTransformToCba( vDes );
        Bac_PtrFree( vDes ); // points to names in pAbcNtk
        if ( p )
        {
            ABC_FREE( p->pSpec );
            p->pSpec = Abc_UtilStrsav( pAbcNtk->pSpec );
        }
        Abc_NtkDelete( pAbcNtk );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
    {
        vDes = Psr_ManReadBlif( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
    {
        vDes = Psr_ManReadVerilog( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "smt" )  )
    {
        vDes = NULL;//Psr_ManReadSmt( pFileName );
        if ( vDes && Vec_PtrSize(vDes) )
            p = Psr_ManBuildCba( pFileName, vDes );
        if ( vDes )
            Psr_ManVecFree( vDes );
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "bac" )  )
    {
        p = Bac_ManReadBac( pFileName );
    }
    else 
    {
        printf( "Unrecognized input file extension.\n" );
        return 0;
    }
    Bac_AbcUpdateMan( pAbc, p );
    return 0;
usage:
    Abc_Print( -2, "usage: @_read [-apvh] <file_name>\n" );
    Abc_Print( -2, "\t         reads hierarchical design in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-a     : toggle using old ABC parser [default = %s]\n", fUseAbc? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle using Ptr construction [default = %s]\n", fUsePtr? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}